

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O3

ImageFeatureType_EnumeratedImageSizes * __thiscall
CoreML::Specification::ImageFeatureType::mutable_enumeratedsizes(ImageFeatureType *this)

{
  ImageFeatureType_EnumeratedImageSizes *this_00;
  
  if (this->_oneof_case_[0] == 0x15) {
    this_00 = (this->SizeFlexibility_).enumeratedsizes_;
  }
  else {
    clear_SizeFlexibility(this);
    this->_oneof_case_[0] = 0x15;
    this_00 = (ImageFeatureType_EnumeratedImageSizes *)operator_new(0x30);
    ImageFeatureType_EnumeratedImageSizes::ImageFeatureType_EnumeratedImageSizes(this_00);
    (this->SizeFlexibility_).enumeratedsizes_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes* ImageFeatureType::mutable_enumeratedsizes() {
  if (!has_enumeratedsizes()) {
    clear_SizeFlexibility();
    set_has_enumeratedsizes();
    SizeFlexibility_.enumeratedsizes_ = new ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.enumeratedSizes)
  return SizeFlexibility_.enumeratedsizes_;
}